

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory.h
# Opt level: O3

pair<int,_float> * __thiscall
directed_flag_complex_in_memory_t<std::pair<int,_float>_>::
get_data<directed_flag_complex_boundary_cell_t>
          (directed_flag_complex_in_memory_t<std::pair<int,_float>_> *this,int dimension,
          directed_flag_complex_boundary_cell_t *vertices)

{
  uint uVar1;
  pair<int,_float> *ppVar2;
  directed_flag_complex_boundary_cell_t local_30;
  
  uVar1 = (**(vertices->super_directed_flag_complex_cell_t)._vptr_directed_flag_complex_cell_t)
                    (vertices,0);
  local_30.super_directed_flag_complex_cell_t.vertices =
       (vertices->super_directed_flag_complex_cell_t).vertices;
  local_30.super_directed_flag_complex_cell_t._vptr_directed_flag_complex_cell_t =
       (_func_int **)&PTR_vertex_0014e2a0;
  local_30.i = vertices->i;
  ppVar2 = directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>::
           get_data<directed_flag_complex_boundary_cell_t>
                     ((directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_> *)
                      ((long)&((this->vertex_cells).
                               super__Vector_base<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->vertex +
                      (ulong)((uVar1 & 0xffff) * 0x18)),dimension,&local_30,0);
  return ppVar2;
}

Assistant:

const ExtraData& get_data(int dimension, const Cell vertices) const {
		return vertex_cells[vertices[0]].get_data(dimension, vertices);
	}